

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::SpecializeLoop
          (LoopUnswitch *this,Loop *loop,Instruction *to_version_insn,Instruction *cst_value)

{
  uint32_t index;
  Instruction *this_00;
  pointer ppVar1;
  DefUseManager *this_01;
  pointer ppVar2;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac;
  Instruction *local_a8;
  DefUseManager *local_a0;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  use_list;
  Loop *local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_a8 = to_version_insn;
  this_01 = IRContext::get_def_use_mgr(this->context_);
  local_70 = 0;
  local_68 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:457:19)>
             ::_M_manager;
  local_60 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:457:19)>
             ::_M_invoke;
  use_list.
  super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  use_list.
  super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  use_list.
  super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._8_8_ = 0;
  local_78 = loop;
  local_58._M_unused._M_object = ::operator_new(0x18);
  *(vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    **)local_58._M_unused._0_8_ = &use_list;
  *(Loop ***)((long)local_58._M_unused._0_8_ + 8) = &local_78;
  *(LoopUnswitch **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:461:29)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:461:29)>
             ::_M_manager;
  local_a0 = this_01;
  analysis::DefUseManager::ForEachUse
            (this_01,local_a8,
             (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  ppVar1 = use_list.
           super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = use_list.
           super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVar2 == ppVar1) {
      std::
      _Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
      ::~_Vector_base(&use_list.
                       super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                     );
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      return;
    }
    if (cst_value == (Instruction *)0x0) break;
    index = ppVar2->second;
    this_00 = ppVar2->first;
    local_ac = Instruction::result_id(cst_value);
    init_list._M_len = 1;
    init_list._M_array = &local_ac;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&local_58,init_list);
    Instruction::SetOperand(this_00,index,(OperandData *)&local_58);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&local_58)
    ;
    analysis::DefUseManager::AnalyzeInstUse(local_a0,this_00);
    ppVar2 = ppVar2 + 1;
  }
  __assert_fail("cst_value && \"We do not have a value to use.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                ,0x1e3,
                "void spvtools::opt::(anonymous namespace)::LoopUnswitch::SpecializeLoop(Loop *, Instruction *, Instruction *)"
               );
}

Assistant:

void SpecializeLoop(Loop* loop, Instruction* to_version_insn,
                      Instruction* cst_value) {
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    std::function<bool(uint32_t)> ignore_node;
    ignore_node = [loop](uint32_t bb_id) { return !loop->IsInsideLoop(bb_id); };

    std::vector<std::pair<Instruction*, uint32_t>> use_list;
    def_use_mgr->ForEachUse(to_version_insn,
                            [&use_list, &ignore_node, this](
                                Instruction* inst, uint32_t operand_index) {
                              BasicBlock* bb = context_->get_instr_block(inst);

                              if (!bb || ignore_node(bb->id())) {
                                // Out of the loop, the specialization does not
                                // apply any more.
                                return;
                              }
                              use_list.emplace_back(inst, operand_index);
                            });

    // First pass: inject the specialized value into the loop (and only the
    // loop).
    for (auto use : use_list) {
      Instruction* inst = use.first;
      uint32_t operand_index = use.second;

      // To also handle switch, cst_value can be nullptr: this case
      // means that we are looking to branch to the default target of
      // the switch. We don't actually know its value so we don't touch
      // it if it not a switch.
      assert(cst_value && "We do not have a value to use.");
      inst->SetOperand(operand_index, {cst_value->result_id()});
      def_use_mgr->AnalyzeInstUse(inst);
    }
  }